

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

ecs_type_t ecs_get_type(ecs_world_t *world,ecs_entity_t entity)

{
  long *plVar1;
  ecs_type_t peVar2;
  
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x98b);
  if (world != (ecs_world_t *)0x0) {
    plVar1 = (long *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,entity);
    if ((plVar1 == (long *)0x0) || ((undefined8 *)*plVar1 == (undefined8 *)0x0)) {
      peVar2 = (ecs_type_t)0x0;
    }
    else {
      peVar2 = *(ecs_type_t *)*plVar1;
    }
    return peVar2;
  }
  __assert_fail("world != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x98b,"ecs_type_t ecs_get_type(ecs_world_t *, ecs_entity_t)");
}

Assistant:

ecs_type_t ecs_get_type(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_record_t *record = NULL;

    record = ecs_eis_get(world, entity);

    ecs_table_t *table;
    if (record && (table = record->table)) {
        return table->type;
    }
    
    return NULL;
}